

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

date_time * __thiscall
booster::locale::date_time::operator=(date_time *this,date_time_period_set *s)

{
  uint uVar1;
  abstract_calendar *paVar2;
  uint uVar3;
  size_t sVar4;
  date_time_period *pdVar5;
  ulong n;
  
  uVar3 = 0;
  while( true ) {
    n = (ulong)uVar3;
    sVar4 = date_time_period_set::size(s);
    paVar2 = (this->impl_).ptr_;
    if (sVar4 <= n) break;
    pdVar5 = date_time_period_set::operator[](s,n);
    uVar1 = *(uint *)pdVar5;
    pdVar5 = date_time_period_set::operator[](s,n);
    (*paVar2->_vptr_abstract_calendar[1])(paVar2,(ulong)uVar1,(ulong)*(uint *)(pdVar5 + 4));
    uVar3 = uVar3 + 1;
  }
  (*paVar2->_vptr_abstract_calendar[2])(paVar2);
  return this;
}

Assistant:

date_time const &date_time::operator=(date_time_period_set const &s)
{
    for(unsigned i=0;i<s.size();i++)
        impl_->set_value(s[i].type.mark(),s[i].value);
    impl_->normalize();
    return *this;
}